

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O0

void test_common<unsigned_short>(uint length,unsigned_short value)

{
  unsigned_short *puVar1;
  element_type *pDst;
  element_type *pDst_00;
  undefined8 *puVar2;
  uint local_64;
  uint local_60;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  unsigned_short *b;
  unsigned_short *a;
  undefined1 local_30 [8];
  shared_ptr<unsigned_short> pb;
  shared_ptr<unsigned_short> pa;
  unsigned_short value_local;
  uint length_local;
  
  puVar1 = nosimd::common::malloc<unsigned_short>(length + 1);
  std::shared_ptr<unsigned_short>::shared_ptr<unsigned_short,void(*)(unsigned_short*),void>
            ((shared_ptr<unsigned_short> *)
             &pb.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar1,
             nosimd::common::free<unsigned_short>);
  puVar1 = nosimd::common::malloc<unsigned_short>(length + 1);
  std::shared_ptr<unsigned_short>::shared_ptr<unsigned_short,void(*)(unsigned_short*),void>
            ((shared_ptr<unsigned_short> *)local_30,puVar1,nosimd::common::free<unsigned_short>);
  pDst = std::__shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2> *)
                    &pb.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pDst_00 = std::__shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  pDst[length] = 0x7f;
  pDst_00[length] = 0x3f;
  sse::common::set<unsigned_short>(value,pDst,length);
  for (i_2 = 0; i_2 < length; i_2 = i_2 + 1) {
    if (pDst[i_2] != value) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar2 = "void test_common(unsigned int, T) [T = unsigned short]";
      *(undefined4 *)(puVar2 + 1) = 0x16;
      *(uint *)((long)puVar2 + 0xc) = length;
      __cxa_throw(puVar2,&Exception::typeinfo,0);
    }
  }
  sse::common::copy<unsigned_short>(pDst,pDst_00,length);
  for (i_3 = 0; i_3 < length; i_3 = i_3 + 1) {
    if (pDst_00[i_3] != value) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar2 = "void test_common(unsigned int, T) [T = unsigned short]";
      *(undefined4 *)(puVar2 + 1) = 0x1d;
      *(uint *)((long)puVar2 + 0xc) = length;
      __cxa_throw(puVar2,&Exception::typeinfo,0);
    }
  }
  sse::common::zero<unsigned_short>(pDst_00,length);
  for (i_4 = 0; i_4 < length; i_4 = i_4 + 1) {
    if (pDst_00[i_4] != 0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar2 = "void test_common(unsigned int, T) [T = unsigned short]";
      *(undefined4 *)(puVar2 + 1) = 0x24;
      *(uint *)((long)puVar2 + 0xc) = length;
      __cxa_throw(puVar2,&Exception::typeinfo,0);
    }
  }
  for (local_60 = 0; local_60 < length; local_60 = local_60 + 1) {
    pDst[local_60] = (element_type)local_60;
  }
  sse::common::copy<unsigned_short>(pDst,pDst_00,length);
  for (local_64 = 0; local_64 < length; local_64 = local_64 + 1) {
    if ((uint)pDst_00[local_64] != (local_64 & 0xffff)) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar2 = "void test_common(unsigned int, T) [T = unsigned short]";
      *(undefined4 *)(puVar2 + 1) = 0x2d;
      *(uint *)((long)puVar2 + 0xc) = length;
      __cxa_throw(puVar2,&Exception::typeinfo,0);
    }
  }
  if ((pDst[length] == 0x7f) && (pDst_00[length] == 0x3f)) {
    std::shared_ptr<unsigned_short>::~shared_ptr((shared_ptr<unsigned_short> *)local_30);
    std::shared_ptr<unsigned_short>::~shared_ptr
              ((shared_ptr<unsigned_short> *)
               &pb.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = "void test_common(unsigned int, T) [T = unsigned short]";
  *(undefined4 *)(puVar2 + 1) = 0x31;
  *(uint *)((long)puVar2 + 0xc) = length;
  __cxa_throw(puVar2,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}